

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::FromString<char_const*>
          (optional<CPubKey> *__return_storage_ptr__,void *this,char *first,char *last)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view hex_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Key key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  CPubKey local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.vch._0_8_ = local_68.vch + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68);
  hex_str._M_str = (char *)local_68.vch._0_8_;
  hex_str._M_len._0_1_ = local_68.vch[8];
  hex_str._M_len._1_1_ = local_68.vch[9];
  hex_str._M_len._2_1_ = local_68.vch[10];
  hex_str._M_len._3_1_ = local_68.vch[0xb];
  hex_str._M_len._4_1_ = local_68.vch[0xc];
  hex_str._M_len._5_1_ = local_68.vch[0xd];
  hex_str._M_len._6_1_ = local_68.vch[0xe];
  hex_str._M_len._7_1_ = local_68.vch[0xf];
  ParseHex<unsigned_char>(&local_80,hex_str);
  if ((uchar *)local_68.vch._0_8_ != local_68.vch + 0x10) {
    operator_delete((void *)local_68.vch._0_8_,local_68.vch._16_8_ + 1);
  }
  CPubKey::
  Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_68,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  if (((local_68.vch[0] & 0xfe) == 2) ||
     ((bVar1 = false, local_68.vch[0] < 8 && ((0xd0U >> (local_68.vch[0] & 0x1f) & 1) != 0)))) {
    memcpy(__return_storage_ptr__,&local_68,0x41);
    bVar1 = true;
  }
  (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
  super__Optional_payload_base<CPubKey>._M_engaged = bVar1;
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromString(I first, I last) const {
        auto bytes = ParseHex(std::string(first, last));
        Key key{bytes.begin(), bytes.end()};
        if (key.IsValid()) return key;
        return {};
    }